

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::BlockingQueueTest_test_poll_will_timeout_Test::
~BlockingQueueTest_test_poll_will_timeout_Test(BlockingQueueTest_test_poll_will_timeout_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BlockingQueueTest, test_poll_will_timeout)
{
    std::chrono::high_resolution_clock::time_point start_time = std::chrono::high_resolution_clock::now();

    BlockingQueue<int> queue = BlockingQueue<int>();
    queue.Poll(std::chrono::milliseconds(250));

    std::chrono::high_resolution_clock::time_point time_now = std::chrono::high_resolution_clock::now();
    std::chrono::high_resolution_clock::duration elapsed = time_now - start_time;

    EXPECT_GT(elapsed, std::chrono::milliseconds(250));
    EXPECT_TRUE(queue.Pop() == queue.End());
}